

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O0

bid_t docio_append_commit_mark(docio_handle *handle,uint64_t doc_offset)

{
  uint8_t uVar1;
  ulong in_RSI;
  docio_handle *in_RDI;
  docio_length dVar2;
  docio_length _length;
  docio_length length;
  bid_t ret_offset;
  void *buf;
  uint64_t _doc_offset;
  uint64_t docsize;
  uint32_t offset;
  undefined8 in_stack_ffffffffffffff78;
  docio_length local_68;
  docio_length local_58;
  docio_length local_48;
  bid_t local_38;
  void *local_30;
  ulong local_28;
  uint64_t local_20;
  uint local_14;
  ulong local_10;
  docio_handle *local_8;
  
  local_14 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  docio_length::docio_length(&local_48);
  docio_length::docio_length(&local_58);
  memset(&local_48,0,0x10);
  local_48.flag = '\x10';
  local_20 = 0x18;
  local_30 = malloc(0x18);
  dVar2.bodylen_ondisk = (int)in_stack_ffffffffffffff78;
  dVar2.flag = (char)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  dVar2.checksum = (char)((ulong)in_stack_ffffffffffffff78 >> 0x28);
  dVar2.reserved = (short)((ulong)in_stack_ffffffffffffff78 >> 0x30);
  dVar2.keylen = 0x52c1;
  dVar2.metalen = 0x12;
  dVar2.bodylen = 0;
  dVar2 = _docio_length_encode(dVar2);
  local_68._0_8_ = dVar2._0_8_;
  local_58.keylen = local_68.keylen;
  local_58.metalen = local_68.metalen;
  local_58.bodylen = local_68.bodylen;
  local_68._8_8_ = dVar2._8_8_;
  local_58.bodylen_ondisk = local_68.bodylen_ondisk;
  local_58.flag = local_68.flag;
  local_58.checksum = local_68.checksum;
  local_58.reserved = local_68.reserved;
  uVar1 = _docio_length_checksum(dVar2,(docio_handle *)0x125308);
  local_58.checksum = uVar1;
  *(undefined8 *)((long)local_30 + (ulong)local_14) = local_58._0_8_;
  *(undefined8 *)((long)local_30 + (ulong)local_14 + 8) = local_58._8_8_;
  local_14 = local_14 + 0x10;
  local_28 = local_10 >> 0x38 | (local_10 & 0xff000000000000) >> 0x28 |
             (local_10 & 0xff0000000000) >> 0x18 | (local_10 & 0xff00000000) >> 8 |
             (local_10 & 0xff000000) << 8 | (local_10 & 0xff0000) << 0x18 |
             (local_10 & 0xff00) << 0x28 | local_10 << 0x38;
  *(ulong *)((long)local_30 + (ulong)local_14) = local_28;
  local_38 = docio_append_doc_raw(local_8,local_20,local_30);
  free(local_30);
  return local_38;
}

Assistant:

bid_t docio_append_commit_mark(struct docio_handle *handle, uint64_t doc_offset)
{
    // Note: should adapt DOCIO_COMMIT_MARK_SIZE if this function is modified.
    uint32_t offset = 0;
    uint64_t docsize;
    uint64_t _doc_offset;
    void *buf;
    bid_t ret_offset;
    struct docio_length length, _length;

    memset(&length, 0, sizeof(struct docio_length));
    length.flag = DOCIO_TXN_COMMITTED;

    docsize = sizeof(struct docio_length) + sizeof(doc_offset);
    buf = (void *)malloc(docsize);

    _length = _docio_length_encode(length);

    // calculate checksum of LENGTH using crc
    _length.checksum = _docio_length_checksum(_length, handle);

    memcpy((uint8_t *)buf + offset, &_length, sizeof(struct docio_length));
    offset += sizeof(struct docio_length);

    // copy doc_offset
    _doc_offset = _endian_encode(doc_offset);
    memcpy((uint8_t *)buf + offset, &_doc_offset, sizeof(_doc_offset));

    ret_offset = docio_append_doc_raw(handle, docsize, buf);
    free(buf);

    return ret_offset;
}